

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall glu::Texture3D::upload(Texture3D *this)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TransferFormat TVar6;
  pointer pPVar7;
  NotSupportedError *this_00;
  TestError *this_01;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  string local_50;
  long lVar5;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (*(long *)(lVar5 + 0x1320) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"glTexImage3D() is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_50);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_glTexture != 0) {
    (**(code **)(lVar5 + 0xb8))(0x806f);
    pcVar1 = *(code **)(lVar5 + 0xff0);
    uVar3 = tcu::TextureFormat::getPixelSize((TextureFormat *)&this->m_refTexture);
    uVar8 = 8;
    if ((int)uVar3 < 8) {
      uVar8 = uVar3;
    }
    uVar10 = 1;
    if ((uVar3 & uVar3 - 1) == 0) {
      uVar10 = uVar8;
    }
    (*pcVar1)(0xcf5,uVar10);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2cf);
    TVar6 = getTransferFormat((this->m_refTexture).super_TextureLevelPyramid.m_format);
    pPVar7 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_refTexture).super_TextureLevelPyramid.m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 3) *
            -0x33333333) {
      lVar9 = 8;
      uVar11 = 0;
      lVar12 = 8;
      do {
        if (*(long *)((long)&((this->m_refTexture).super_TextureLevelPyramid.m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12) != 0) {
          (**(code **)(lVar5 + 0x1320))
                    (0x806f,uVar11 & 0xffffffff,this->m_format,
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -4),
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar9),0,TVar6,
                     (ulong)TVar6 >> 0x20,
                     *(undefined8 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9 + 4));
        }
        uVar11 = uVar11 + 1;
        pPVar7 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x10;
        lVar9 = lVar9 + 0x28;
      } while ((long)uVar11 <
               (long)((int)((ulong)((long)(this->m_refTexture).super_TextureLevelPyramid.m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7)
                           >> 3) * -0x33333333));
    }
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2de);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x2cc);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture3D::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	if (!gl.texImage3D)
		throw tcu::NotSupportedError("glTexImage3D() is not supported");

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_3D, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*access.getWidth()*access.getHeight());
		gl.texImage3D(GL_TEXTURE_3D, levelNdx, m_format, access.getWidth(), access.getHeight(), access.getDepth(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}